

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.cpp
# Opt level: O1

void * HokuyoThread(void *pParam)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  interval *piVar9;
  ulong uVar10;
  ulong uVar11;
  int i;
  long lVar12;
  uint uVar13;
  CHRONO chrono_period;
  char szTemp [256];
  HOKUYO hokuyo;
  char szSaveFilePath [256];
  char databuf [8192];
  double distances [2048];
  double angles [2048];
  int local_a824;
  int local_a820;
  int local_a81c;
  timeval local_a818;
  timespec local_a808;
  double local_a7f8;
  double dStack_a7f0;
  double local_a7e8;
  double dStack_a7e0;
  timespec local_a7d8;
  int local_a7c8;
  double local_a7c0;
  char local_a7b8 [264];
  HOKUYO local_a6b0;
  char local_a138 [256];
  interval local_a038 [341];
  double local_8038 [2048];
  double local_4038 [2049];
  
  memset(&local_a6b0,0,0x578);
  iVar3 = clock_getres(4,&local_a7d8);
  if ((iVar3 == 0) && (iVar3 = clock_gettime(4,&local_a808), iVar3 == 0)) {
    local_a7c8 = 0;
    local_a7f8 = 0.0;
    dStack_a7f0 = 0.0;
    local_a7e8 = 0.0;
    dStack_a7e0 = 0.0;
  }
  local_a824 = 100;
  bVar1 = false;
  local_a820 = 0;
  do {
    while( true ) {
      if (local_a7c8 == 0) {
        clock_gettime(4,(timespec *)local_a038);
        local_a7f8 = local_a038[0].inf;
        dStack_a7f0 = local_a038[0].sup;
        local_a038[0].inf =
             (double)(((long)local_a038[0].inf + (long)local_a7e8 +
                      ((long)local_a038[0].sup + (long)dStack_a7e0) / 1000000000) -
                     local_a808.tv_sec);
        local_a038[0].sup =
             (double)(((long)local_a038[0].sup + (long)dStack_a7e0) % 1000000000 -
                     local_a808.tv_nsec);
        if ((long)local_a038[0].sup < 0) {
          local_a038[0].inf =
               (double)((long)local_a038[0].inf + (long)local_a038[0].sup / 1000000000 + -1);
          local_a038[0].sup = (double)((long)local_a038[0].sup % 1000000000 + 1000000000);
        }
        local_a7e8 = local_a038[0].inf;
        dStack_a7e0 = local_a038[0].sup;
      }
      iVar3 = clock_getres(4,&local_a7d8);
      if ((iVar3 == 0) && (iVar3 = clock_gettime(4,&local_a808), iVar3 == 0)) {
        local_a7c8 = 0;
        local_a7e8 = 0.0;
        dStack_a7e0 = 0.0;
        local_a7f8 = 0.0;
        dStack_a7f0 = 0.0;
      }
      if (bPauseHokuyo == 0) break;
      if (bVar1) {
        puts("Hokuyo paused.");
        DisconnectHokuyo(&local_a6b0);
      }
      if (bExit != 0) {
        bVar2 = true;
        goto LAB_001c7fcb;
      }
      local_a038[0].inf = 0.0;
      local_a038[0].sup = 4.94065645841247e-316;
      bVar1 = false;
      nanosleep((timespec *)local_a038,(timespec *)0x0);
    }
    if (bRestartHokuyo != 0) {
      if (bVar1) {
        puts("Restarting a Hokuyo.");
        DisconnectHokuyo(&local_a6b0);
      }
      bRestartHokuyo = 0;
      bVar1 = false;
    }
    if (bVar1) {
      memset(local_a038,0,0x2000);
      local_a81c = 0;
      iVar3 = GetLatestHokuyoMessageHokuyo(&local_a6b0,(char *)local_a038,0x2000,&local_a81c);
      if (iVar3 == 0) {
        if (0 < local_a81c) {
          uVar11 = 0;
          piVar9 = local_a038;
          do {
            local_4038[uVar11] =
                 ((double)((local_a6b0.StartingStep - local_a6b0.FrontStep) +
                           local_a6b0.SlitDivision / 2 + (int)uVar11) * local_a6b0.StepAngleSize *
                 3.141592653589793) / 180.0 + -3.141592653589793;
            lVar12 = 0;
            uVar13 = 0;
            do {
              uVar13 = (int)*(char *)((long)&piVar9->inf + lVar12) - 0x30U | uVar13 << 6;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            local_8038[uVar11] = (double)(int)uVar13 / 1000.0;
            uVar11 = uVar11 + 1;
            piVar9 = (interval *)((long)&piVar9->inf + 3);
          } while (uVar11 != (local_a81c - 1U) / 3 + 1);
        }
        iVar3 = gettimeofday(&local_a818,(__timezone_ptr_t)0x0);
        if (iVar3 != 0) {
          local_a818.tv_sec = 0;
          local_a818.tv_usec = 0;
        }
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        if (0 < local_a6b0.StepCount) {
          local_a7c0 = (double)local_a818.tv_usec * 1e-06 + (double)local_a818.tv_sec;
          lVar12 = 0;
          do {
            alpha_mes_hokuyo = local_4038[lVar12];
            d_mes_hokuyo = local_8038[lVar12];
            if (d_all_mes_hokuyo.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                d_all_mes_hokuyo.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
                super__Vector_impl_data._M_start) {
              d_all_mes_hokuyo.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   d_all_mes_hokuyo.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            interval::interval(local_a038,&d_mes_hokuyo);
            std::vector<interval,_std::allocator<interval>_>::emplace_back<interval>
                      (&d_all_mes_hokuyo,(vector<interval,_std::allocator<interval>_> *)local_a038);
            if (alpha_mes_hokuyo_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur ==
                alpha_mes_hokuyo_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                        ((deque<double,std::allocator<double>> *)&alpha_mes_hokuyo_vector,
                         &alpha_mes_hokuyo);
            }
            else {
              *alpha_mes_hokuyo_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur = alpha_mes_hokuyo;
              alpha_mes_hokuyo_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur =
                   alpha_mes_hokuyo_vector.super__Deque_base<double,_std::allocator<double>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
            if (d_mes_hokuyo_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur ==
                d_mes_hokuyo_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                        ((deque<double,std::allocator<double>> *)&d_mes_hokuyo_vector,&d_mes_hokuyo)
              ;
            }
            else {
              *d_mes_hokuyo_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur = d_mes_hokuyo;
              d_mes_hokuyo_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur =
                   d_mes_hokuyo_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur + 1;
            }
            std::
            deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
            ::push_back(&d_all_mes_hokuyo_vector,&d_all_mes_hokuyo);
            local_a038[0].inf = local_a7c0;
            std::deque<double,_std::allocator<double>_>::emplace_back<double>
                      (&t_hokuyo_history_vector,&local_a038[0].inf);
            std::deque<interval,_std::allocator<interval>_>::push_back
                      (&xhat_hokuyo_history_vector,(value_type *)&xhat);
            std::deque<interval,_std::allocator<interval>_>::push_back
                      (&yhat_hokuyo_history_vector,(value_type *)&yhat);
            std::deque<interval,_std::allocator<interval>_>::push_back
                      (&psihat_hokuyo_history_vector,(value_type *)&psihat);
            std::deque<interval,_std::allocator<interval>_>::push_back
                      (&vrxhat_hokuyo_history_vector,(value_type *)&vrxhat);
            if (local_a6b0.StepCount <
                (int)((int)((ulong)((long)alpha_mes_hokuyo_vector.
                                          super__Deque_base<double,_std::allocator<double>_>._M_impl
                                          .super__Deque_impl_data._M_start._M_last -
                                   (long)alpha_mes_hokuyo_vector.
                                         super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                         super__Deque_impl_data._M_start._M_cur) >> 3) +
                      (int)((ulong)((long)alpha_mes_hokuyo_vector.
                                          super__Deque_base<double,_std::allocator<double>_>._M_impl
                                          .super__Deque_impl_data._M_finish._M_cur -
                                   (long)alpha_mes_hokuyo_vector.
                                         super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                         super__Deque_impl_data._M_finish._M_first) >> 3) +
                     ((((uint)((int)alpha_mes_hokuyo_vector.
                                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                    super__Deque_impl_data._M_finish._M_node -
                              (int)alpha_mes_hokuyo_vector.
                                   super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                   super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                     (uint)(alpha_mes_hokuyo_vector.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x40))
            {
              std::deque<double,_std::allocator<double>_>::pop_front(&alpha_mes_hokuyo_vector);
              std::deque<double,_std::allocator<double>_>::pop_front(&d_mes_hokuyo_vector);
              std::
              deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
              ::pop_front(&d_all_mes_hokuyo_vector);
              std::deque<double,_std::allocator<double>_>::pop_front(&t_hokuyo_history_vector);
              std::deque<interval,_std::allocator<interval>_>::pop_front
                        (&xhat_hokuyo_history_vector);
              std::deque<interval,_std::allocator<interval>_>::pop_front
                        (&yhat_hokuyo_history_vector);
              std::deque<interval,_std::allocator<interval>_>::pop_front
                        (&psihat_hokuyo_history_vector);
              std::deque<interval,_std::allocator<interval>_>::pop_front
                        (&vrxhat_hokuyo_history_vector);
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < local_a6b0.StepCount);
        }
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        bVar1 = true;
        if (local_a6b0.bSaveRawData != 0) {
          fprintf((FILE *)local_a6b0.pfSaveFile,"%d;%d;",local_a818.tv_sec & 0xffffffff,
                  local_a818.tv_usec & 0xffffffff);
          if (0 < local_a6b0.StepCount) {
            lVar12 = 0;
            do {
              fprintf((FILE *)local_a6b0.pfSaveFile,"%.3f;%.3f;",SUB84(local_4038[lVar12],0),
                      local_8038[lVar12]);
              lVar12 = lVar12 + 1;
            } while (lVar12 < local_a6b0.StepCount);
          }
          fputc(10,(FILE *)local_a6b0.pfSaveFile);
          fflush((FILE *)local_a6b0.pfSaveFile);
        }
        bVar2 = false;
      }
      else {
        puts("Connection to a Hokuyo lost.");
        DisconnectHokuyo(&local_a6b0);
        local_a038[0].inf = (double)((long)local_a824 / 1000);
        local_a038[0].sup = (double)(((long)local_a824 % 1000) * 1000000);
LAB_001c7aad:
        bVar1 = false;
        nanosleep((timespec *)local_a038,(timespec *)0x0);
        bVar2 = true;
      }
    }
    else {
      iVar3 = ConnectHokuyo(&local_a6b0,"Hokuyo0.txt");
      if (iVar3 != 0) {
        local_a038[0].inf = 4.94065645841247e-324;
        local_a038[0].sup = 0.0;
        goto LAB_001c7aad;
      }
      local_a824 = local_a6b0.threadperiod;
      local_a818.tv_sec = 0;
      local_a818.tv_usec = 0;
      memset(local_4038,0,0x4000);
      memset(local_8038,0,0x4000);
      if ((FILE *)local_a6b0.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_a6b0.pfSaveFile);
        local_a6b0.pfSaveFile = (FILE *)0x0;
      }
      bVar2 = false;
      bVar1 = true;
      if ((local_a6b0.bSaveRawData != 0) && ((FILE *)local_a6b0.pfSaveFile == (FILE *)0x0)) {
        if (local_a6b0.szCfgFilePath[0] == '\0') {
          builtin_strncpy(local_a7b8,"hokuyo",7);
        }
        else {
          sprintf(local_a7b8,"%.127s",local_a6b0.szCfgFilePath);
        }
        sVar4 = strlen(local_a7b8);
        uVar13 = (uint)sVar4;
        uVar10 = sVar4 & 0xffffffff;
        uVar6 = (int)uVar13 >> 0x1f & uVar13;
        uVar11 = sVar4 & 0xffffffff;
        do {
          uVar10 = uVar10 - 1;
          uVar8 = (uint)uVar11;
          uVar11 = (ulong)(uVar6 - 1);
          uVar7 = uVar6;
          if ((int)uVar8 < 1) break;
          uVar11 = (ulong)(uVar8 - 1);
          uVar7 = uVar8;
        } while (local_a7b8[uVar10 & 0xffffffff] != '.');
        if ((int)uVar7 <= (int)uVar13 && 1 < (int)uVar7) {
          memset(local_a7b8 + uVar11,0,sVar4 - uVar11);
        }
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar5 = strtimeex_fns();
        sprintf(local_a138,"log/%.127s_%.64s.csv",local_a7b8,pcVar5);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        local_a6b0.pfSaveFile = (FILE *)fopen(local_a138,"w");
        if ((FILE *)local_a6b0.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create Hokuyo data file.");
          bVar2 = false;
          goto LAB_001c7fcb;
        }
        fwrite("tv_sec;tv_usec;angle (in rad, 0 is front);distance (in m);...\n",0x3e,1,
               (FILE *)local_a6b0.pfSaveFile);
        fflush((FILE *)local_a6b0.pfSaveFile);
        bVar2 = false;
      }
    }
    if ((bVar2) &&
       (local_a820 = local_a820 + 1, ExitOnErrorCount <= local_a820 && 0 < ExitOnErrorCount)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001c7fcb:
      if (local_a7c8 == 0) {
        clock_gettime(4,(timespec *)local_a038);
        local_a7f8 = local_a038[0].inf;
        dStack_a7f0 = local_a038[0].sup;
        local_a038[0].inf =
             (double)(((long)local_a038[0].inf + (long)local_a7e8 +
                      ((long)local_a038[0].sup + (long)dStack_a7e0) / 1000000000) -
                     local_a808.tv_sec);
        local_a038[0].sup =
             (double)(((long)local_a038[0].sup + (long)dStack_a7e0) % 1000000000 -
                     local_a808.tv_nsec);
        if ((long)local_a038[0].sup < 0) {
          local_a038[0].inf =
               (double)((long)local_a038[0].inf + (long)local_a038[0].sup / 1000000000 + -1);
          local_a038[0].sup = (double)((long)local_a038[0].sup % 1000000000 + 1000000000);
        }
        local_a7e8 = local_a038[0].inf;
        dStack_a7e0 = local_a038[0].sup;
      }
      if ((FILE *)local_a6b0.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_a6b0.pfSaveFile);
        local_a6b0.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar2) {
        DisconnectHokuyo(&local_a6b0);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE HokuyoThread(void* pParam)
{
	HOKUYO hokuyo;
	//HOKUYODATA hokuyodata;
	struct timeval tv;
	double angles[MAX_SLITDIVISION_HOKUYO];
	double distances[MAX_SLITDIVISION_HOKUYO];
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&hokuyo, 0, sizeof(HOKUYO));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		//mSleep(threadperiod);

		if (bPauseHokuyo) 
		{
			if (bConnected)
			{
				printf("Hokuyo paused.\n");
				bConnected = FALSE;
				DisconnectHokuyo(&hokuyo);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartHokuyo) 
		{
			if (bConnected)
			{
				printf("Restarting a Hokuyo.\n");
				bConnected = FALSE;
				DisconnectHokuyo(&hokuyo);
			}
			bRestartHokuyo = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectHokuyo(&hokuyo, "Hokuyo0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = hokuyo.threadperiod;

				memset(&tv, 0, sizeof(tv));
				memset(angles, 0, sizeof(angles));
				memset(distances, 0, sizeof(distances));

				if (hokuyo.pfSaveFile != NULL)
				{
					fclose(hokuyo.pfSaveFile); 
					hokuyo.pfSaveFile = NULL;
				}
				if ((hokuyo.bSaveRawData)&&(hokuyo.pfSaveFile == NULL)) 
				{
					if (strlen(hokuyo.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", hokuyo.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "hokuyo");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.csv", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					hokuyo.pfSaveFile = fopen(szSaveFilePath, "w");
					if (hokuyo.pfSaveFile == NULL) 
					{
						printf("Unable to create Hokuyo data file.\n");
						break;
					}
					fprintf(hokuyo.pfSaveFile, 
						"tv_sec;tv_usec;angle (in rad, 0 is front);distance (in m);...\n"
						); 
					fflush(hokuyo.pfSaveFile);
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetLatestDataHokuyo(&hokuyo, distances, angles) == EXIT_SUCCESS)
			{
				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				EnterCriticalSection(&StateVariablesCS);

				for (i = 0; i < hokuyo.StepCount; i++)
				{
					alpha_mes_hokuyo = angles[i];
					d_mes_hokuyo = distances[i];

					// For compatibility with a Seanet...
					d_all_mes_hokuyo.clear();
					d_all_mes_hokuyo.push_back(d_mes_hokuyo);

					alpha_mes_hokuyo_vector.push_back(alpha_mes_hokuyo);
					d_mes_hokuyo_vector.push_back(d_mes_hokuyo);
					d_all_mes_hokuyo_vector.push_back(d_all_mes_hokuyo);
					t_hokuyo_history_vector.push_back(tv.tv_sec+0.000001*tv.tv_usec);
					xhat_hokuyo_history_vector.push_back(xhat);
					yhat_hokuyo_history_vector.push_back(yhat);
					psihat_hokuyo_history_vector.push_back(psihat);
					vrxhat_hokuyo_history_vector.push_back(vrxhat);

					if ((int)alpha_mes_hokuyo_vector.size() > hokuyo.StepCount)
					{
						alpha_mes_hokuyo_vector.pop_front();
						d_mes_hokuyo_vector.pop_front();
						d_all_mes_hokuyo_vector.pop_front();
						t_hokuyo_history_vector.pop_front();
						xhat_hokuyo_history_vector.pop_front();
						yhat_hokuyo_history_vector.pop_front();
						psihat_hokuyo_history_vector.pop_front();
						vrxhat_hokuyo_history_vector.pop_front();
					}
				}

				LeaveCriticalSection(&StateVariablesCS);

				if (hokuyo.bSaveRawData)
				{
					//for (i = 0; i < hokuyo.StepCount; i++)
					//{
					//	fprintf(hokuyo.pfSaveFile, "%d;%d;%.3f;%.3f;\n", (int)tv.tv_sec, (int)tv.tv_usec, angles[i], distances[i]);
					//}
					fprintf(hokuyo.pfSaveFile, "%d;%d;", (int)tv.tv_sec, (int)tv.tv_usec);
					for (i = 0; i < hokuyo.StepCount; i++)
					{
						fprintf(hokuyo.pfSaveFile, "%.3f;%.3f;", angles[i], distances[i]);
					}
					fprintf(hokuyo.pfSaveFile, "\n");
					fflush(hokuyo.pfSaveFile);
				}
			}
			else
			{
				printf("Connection to a Hokuyo lost.\n");
				bConnected = FALSE;
				DisconnectHokuyo(&hokuyo);
				mSleep(threadperiod);
			}
		}

		//printf("HokuyoThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (hokuyo.pfSaveFile != NULL)
	{
		fclose(hokuyo.pfSaveFile); 
		hokuyo.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectHokuyo(&hokuyo);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}